

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase676::run(TestCase676 *this)

{
  Reader reader;
  bool bVar1;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int in_R8D;
  Reader RVar2;
  undefined4 in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa0c;
  int local_5b8;
  bool local_5b1;
  int local_5b0;
  DebugExpression<int> DStack_5ac;
  bool _kj_shouldLog_4;
  undefined1 local_5a8 [8];
  DebugComparison<int,_int_&> _kjCondition_4;
  int local_578;
  DebugExpression<int> DStack_574;
  bool _kj_shouldLog_3;
  undefined1 local_570 [8];
  DebugComparison<int,_int_&> _kjCondition_3;
  SourceLocation local_510;
  undefined1 auStack_4f8 [8];
  Response<capnproto_test::capnp::test::TestAllTypes> response2;
  bool local_4a1;
  undefined1 auStack_4a0 [7];
  bool _kj_shouldLog_2;
  size_t local_498;
  char (*local_490) [4];
  undefined1 local_488 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_2;
  SourceLocation local_450;
  undefined1 local_438 [8];
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  int local_3f0;
  DebugExpression<int> DStack_3ec;
  bool _kj_shouldLog_1;
  undefined1 local_3e8 [8];
  DebugComparison<int,_int_&> _kjCondition_1;
  int local_3b8;
  DebugExpression<int> DStack_3b4;
  bool _kj_shouldLog;
  undefined1 local_3b0 [8];
  DebugComparison<int,_int_&> _kjCondition;
  undefined1 local_358 [8];
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> pipelinePromise2;
  Maybe<capnp::MessageSize> local_320;
  Pipeline local_308;
  Client local_2e0;
  Client local_2c8;
  undefined1 local_2b0 [8];
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  pipelineRequest2;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> pipelinePromise;
  Maybe<capnp::MessageSize> local_240;
  Pipeline local_228;
  Client local_200;
  undefined1 local_1e8 [8];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  pipelineRequest;
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> promise;
  Client local_170;
  Maybe<capnp::MessageSize> local_150;
  undefined1 local_138 [8];
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  request;
  Client local_f0;
  undefined1 local_d8 [8];
  Client client;
  int local_b8;
  int chainedCallCount;
  int callCount;
  undefined1 local_a8 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase676 *this_local;
  
  kj::EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
  kj::WaitScope::WaitScope((WaitScope *)local_a8,(EventLoop *)&waitScope.runningStacksPool);
  local_b8 = 0;
  client._20_4_ = 0;
  kj::heap<capnp::_::(anonymous_namespace)::TestPipelineDynamicImpl,int&>
            ((kj *)&request.hook.ptr,&local_b8);
  DynamicCapability::Client::Client<capnp::_::(anonymous_namespace)::TestPipelineDynamicImpl,void>
            (&local_f0,
             (Own<capnp::_::(anonymous_namespace)::TestPipelineDynamicImpl,_std::nullptr_t> *)
             &request.hook.ptr);
  Capability::Client::castAs<capnproto_test::capnp::test::TestPipeline>
            ((Client *)local_d8,&local_f0.super_Client);
  DynamicCapability::Client::~Client(&local_f0);
  kj::Own<capnp::_::(anonymous_namespace)::TestPipelineDynamicImpl,_std::nullptr_t>::~Own
            ((Own<capnp::_::(anonymous_namespace)::TestPipelineDynamicImpl,_std::nullptr_t> *)
             &request.hook.ptr);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_150);
  capnproto_test::capnp::test::TestPipeline::Client::getCapRequest
            ((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
              *)local_138,(Client *)local_d8,&local_150);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_150);
  capnproto_test::capnp::test::TestPipeline::GetCapParams::Builder::setN((Builder *)local_138,0xea);
  kj::heap<capnp::_::TestInterfaceImpl,int&>
            ((kj *)&promise.super_Pipeline._typeless.ops.disposer,(int *)&client.field_0x14);
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestInterfaceImpl,void>
            (&local_170,
             (Own<capnp::_::TestInterfaceImpl,_std::nullptr_t> *)
             &promise.super_Pipeline._typeless.ops.disposer);
  capnproto_test::capnp::test::TestPipeline::GetCapParams::Builder::setInCap
            ((Builder *)local_138,&local_170);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_170);
  kj::Own<capnp::_::TestInterfaceImpl,_std::nullptr_t>::~Own
            ((Own<capnp::_::TestInterfaceImpl,_std::nullptr_t> *)
             &promise.super_Pipeline._typeless.ops.disposer);
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::send((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
          *)&pipelineRequest.hook.ptr,(int)local_138,__buf,in_RCX,in_R8D);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::getOutBox
            (&local_228,(Pipeline *)&promise);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap(&local_200,&local_228);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_240);
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_1e8,&local_200,&local_240);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_240);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_200);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::~Pipeline(&local_228);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setI((Builder *)local_1e8,0x141);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)&pipelineRequest2.hook.ptr,(int)local_1e8,__buf_00,in_RCX,in_R8D);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::getOutBox
            (&local_308,(Pipeline *)&promise);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap(&local_2e0,&local_308);
  Capability::Client::castAs<capnproto_test::capnp::test::TestExtends>
            (&local_2c8,(Client *)(local_2e0._vptr_Client[-3] + (long)&local_2e0._vptr_Client));
  kj::Maybe<capnp::MessageSize>::Maybe(&local_320);
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            ((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
              *)local_2b0,&local_2c8,&local_320);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_320);
  capnproto_test::capnp::test::TestExtends::Client::~Client(&local_2c8);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_2e0);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::~Pipeline(&local_308);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
          *)local_358,(int)local_2b0,__buf_01,in_RCX,in_R8D);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)
             &_kjCondition.result,(void *)0x0);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::operator=
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)
             &pipelineRequest.hook.ptr,
             (RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)
             &_kjCondition.result);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)
             &_kjCondition.result);
  local_3b8 = 0;
  DStack_3b4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3b8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_3b0,&stack0xfffffffffffffc4c,&local_b8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3b0);
  if (!bVar1) {
    _kjCondition_1._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._39_1_ != '\0') {
      _kjCondition_1.result = false;
      _kjCondition_1._33_3_ = 0;
      kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x2bd,ERROR,
                 "\"failed: expected \" \"(0) == (callCount)\", _kjCondition, 0, callCount",
                 (char (*) [36])"failed: expected (0) == (callCount)",
                 (DebugComparison<int,_int_&> *)local_3b0,(int *)&_kjCondition_1.result,&local_b8);
      _kjCondition_1._39_1_ = 0;
    }
  }
  local_3f0 = 0;
  DStack_3ec = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3f0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_3e8,&stack0xfffffffffffffc14,
             (int *)&client.field_0x14);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3e8);
  if (!bVar1) {
    response.hook.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)response.hook.ptr._7_1_ != false) {
      response.hook.ptr._0_4_ = 0;
      kj::_::Debug::log<char_const(&)[43],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x2be,ERROR,
                 "\"failed: expected \" \"(0) == (chainedCallCount)\", _kjCondition, 0, chainedCallCount"
                 ,(char (*) [43])"failed: expected (0) == (chainedCallCount)",
                 (DebugComparison<int,_int_&> *)local_3e8,(int *)&response.hook.ptr,
                 (int *)&client.field_0x14);
      response.hook.ptr._7_1_ = false;
    }
  }
  kj::SourceLocation::SourceLocation
            (&local_450,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
             ,&DAT_009b6b8e,0x2c0,0x13);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             local_438,&pipelineRequest2.hook.ptr);
  local_490 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x9f29a5);
  _auStack_4a0 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                           ((Reader *)local_438);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_488,
             (DebugExpression<char_const(&)[4]> *)&local_490,(Reader *)auStack_4a0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_488);
  if (!bVar1) {
    local_4a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_4a1 != false) {
      RVar2 = capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                        ((Reader *)local_438);
      response2.hook.ptr = RVar2.super_StringPtr.content.ptr;
      kj::_::Debug::
      log<char_const(&)[46],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x2c1,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (response.getX())\", _kjCondition, \"bar\", response.getX()"
                 ,(char (*) [46])"failed: expected (\"bar\") == (response.getX())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_488,
                 (char (*) [4])0x9f29a5,(Reader *)&response2.hook.ptr);
      local_4a1 = false;
    }
  }
  kj::SourceLocation::SourceLocation
            (&local_510,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
             ,&DAT_009b6b8e,0x2c3,0x14);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)auStack_4f8,
             local_358);
  _kjCondition_3._32_8_ = auStack_4f8;
  reader._reader.capTable = response2.super_Reader._reader.capTable;
  reader._reader.segment = response2.super_Reader._reader.segment;
  reader._reader.data = response2.super_Reader._reader.data;
  reader._reader.pointers = response2.super_Reader._reader.pointers;
  reader._reader.dataSize = response2.super_Reader._reader.dataSize;
  reader._reader.pointerCount = response2.super_Reader._reader.pointerCount;
  reader._reader._38_2_ = response2.super_Reader._reader._38_2_;
  reader._reader.nestingLimit = in_stack_fffffffffffffa08;
  reader._reader._44_4_ = in_stack_fffffffffffffa0c;
  checkTestMessage(reader);
  local_578 = 3;
  DStack_574 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_578);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_570,&stack0xfffffffffffffa8c,&local_b8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_570);
  if (!bVar1) {
    _kjCondition_4._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_4._39_1_ != '\0') {
      _kjCondition_4.result = true;
      _kjCondition_4._33_3_ = 0;
      kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x2c6,ERROR,
                 "\"failed: expected \" \"(3) == (callCount)\", _kjCondition, 3, callCount",
                 (char (*) [36])"failed: expected (3) == (callCount)",
                 (DebugComparison<int,_int_&> *)local_570,(int *)&_kjCondition_4.result,&local_b8);
      _kjCondition_4._39_1_ = 0;
    }
  }
  local_5b0 = 1;
  DStack_5ac = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_5b0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_5a8,&stack0xfffffffffffffa54,
             (int *)&client.field_0x14);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5a8);
  if (!bVar1) {
    local_5b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_5b1 != false) {
      local_5b8 = 1;
      kj::_::Debug::log<char_const(&)[43],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x2c7,ERROR,
                 "\"failed: expected \" \"(1) == (chainedCallCount)\", _kjCondition, 1, chainedCallCount"
                 ,(char (*) [43])"failed: expected (1) == (chainedCallCount)",
                 (DebugComparison<int,_int_&> *)local_5a8,&local_5b8,(int *)&client.field_0x14);
      local_5b1 = false;
    }
  }
  Response<capnproto_test::capnp::test::TestAllTypes>::~Response
            ((Response<capnproto_test::capnp::test::TestAllTypes> *)auStack_4f8);
  Response<capnproto_test::capnp::test::TestInterface::FooResults>::~Response
            ((Response<capnproto_test::capnp::test::TestInterface::FooResults> *)local_438);
  RemotePromise<capnproto_test::capnp::test::TestAllTypes>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestAllTypes> *)local_358);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::~Request((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
              *)local_2b0);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)
             &pipelineRequest2.hook.ptr);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_1e8);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)
             &pipelineRequest.hook.ptr);
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::~Request((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
              *)local_138);
  capnproto_test::capnp::test::TestPipeline::Client::~Client((Client *)local_d8);
  kj::WaitScope::~WaitScope((WaitScope *)local_a8);
  kj::EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
  return;
}

Assistant:

TEST(Capability, DynamicServerPipelining) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  int chainedCallCount = 0;
  test::TestPipeline::Client client =
      DynamicCapability::Client(kj::heap<TestPipelineDynamicImpl>(callCount))
          .castAs<test::TestPipeline>();

  auto request = client.getCapRequest();
  request.setN(234);
  request.setInCap(test::TestInterface::Client(kj::heap<TestInterfaceImpl>(chainedCallCount)));

  auto promise = request.send();

  auto pipelineRequest = promise.getOutBox().getCap().fooRequest();
  pipelineRequest.setI(321);
  auto pipelinePromise = pipelineRequest.send();

  auto pipelineRequest2 = promise.getOutBox().getCap().castAs<test::TestExtends>().graultRequest();
  auto pipelinePromise2 = pipelineRequest2.send();

  promise = nullptr;  // Just to be annoying, drop the original promise.

  EXPECT_EQ(0, callCount);
  EXPECT_EQ(0, chainedCallCount);

  auto response = pipelinePromise.wait(waitScope);
  EXPECT_EQ("bar", response.getX());

  auto response2 = pipelinePromise2.wait(waitScope);
  checkTestMessage(response2);

  EXPECT_EQ(3, callCount);
  EXPECT_EQ(1, chainedCallCount);
}